

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::ProcessEdgesAtTopOfScanbeam(Clipper *this,cInt topY)

{
  TEdge *e_00;
  IntPoint OffPt;
  bool bVar1;
  TEdge *pTVar2;
  cInt cVar3;
  OutPt *pOVar4;
  OutPt *op2_00;
  byte local_141;
  OutPt *op2_2;
  OutPt *op2_1;
  TEdge *eNext;
  TEdge *ePrev_2;
  OutPt *op_1;
  OutPt *op2;
  OutPt *op;
  IntPoint pt;
  TEdge *ePrev_1;
  TEdge *ePrev;
  TEdge *eMaxPair;
  TEdge *pTStack_20;
  bool IsMaximaEdge;
  TEdge *e;
  cInt topY_local;
  Clipper *this_local;
  
  pTStack_20 = *(TEdge **)
                (this->_vptr_Clipper[-3] + 0x10 +
                (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>);
  e = (TEdge *)topY;
  topY_local = (cInt)this;
  while (pTStack_20 != (TEdge *)0x0) {
    eMaxPair._7_1_ = IsMaxima(pTStack_20,(cInt)e);
    if (eMaxPair._7_1_) {
      pTVar2 = GetMaximaPairEx(pTStack_20);
      local_141 = 1;
      if (pTVar2 != (TEdge *)0x0) {
        bVar1 = IsHorizontal(pTVar2);
        local_141 = bVar1 ^ 0xff;
      }
      eMaxPair._7_1_ = (bool)(local_141 & 1);
    }
    if (eMaxPair._7_1_ == false) {
      bVar1 = IsIntermediate(pTStack_20,(cInt)e);
      if ((bVar1) && (bVar1 = IsHorizontal(pTStack_20->NextInLML), bVar1)) {
        ClipperBase::UpdateEdgeIntoAEL
                  ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),
                   &stack0xffffffffffffffe0);
        if (-1 < pTStack_20->OutIdx) {
          AddOutPt(this,pTStack_20,&pTStack_20->Bot);
        }
        AddEdgeToSEL(this,pTStack_20);
      }
      else {
        cVar3 = TopX(pTStack_20,(cInt)e);
        (pTStack_20->Curr).X = cVar3;
        (pTStack_20->Curr).Y = (cInt)e;
      }
      if (((((this->m_StrictSimple & 1U) != 0) &&
           (pt.Y = (cInt)pTStack_20->PrevInAEL, -1 < pTStack_20->OutIdx)) &&
          (pTStack_20->WindDelta != 0)) &&
         ((((TEdge *)pt.Y != (TEdge *)0x0 && (-1 < ((TEdge *)pt.Y)->OutIdx)) &&
          (((((TEdge *)pt.Y)->Curr).X == (pTStack_20->Curr).X && (((TEdge *)pt.Y)->WindDelta != 0)))
          ))) {
        op = (OutPt *)(pTStack_20->Curr).X;
        pt.X = (pTStack_20->Curr).Y;
        pOVar4 = AddOutPt(this,(TEdge *)pt.Y,(IntPoint *)&op);
        op2_00 = AddOutPt(this,pTStack_20,(IntPoint *)&op);
        OffPt.Y = pt.X;
        OffPt.X = (cInt)op;
        AddJoin(this,pOVar4,op2_00,OffPt);
      }
      pTStack_20 = pTStack_20->NextInAEL;
    }
    else {
      if ((this->m_StrictSimple & 1U) != 0) {
        std::__cxx11::list<long_long,_std::allocator<long_long>_>::push_back
                  (&this->m_Maxima,&(pTStack_20->Top).X);
      }
      pTVar2 = pTStack_20->PrevInAEL;
      DoMaxima(this,pTStack_20);
      if (pTVar2 == (TEdge *)0x0) {
        pTStack_20 = *(TEdge **)
                      (this->_vptr_Clipper[-3] + 0x10 +
                      (long)&(this->m_Maxima).
                             super__List_base<long_long,_std::allocator<long_long>_>);
      }
      else {
        pTStack_20 = pTVar2->NextInAEL;
      }
    }
  }
  std::__cxx11::list<long_long,_std::allocator<long_long>_>::sort(&this->m_Maxima);
  ProcessHorizontals(this);
  std::__cxx11::list<long_long,_std::allocator<long_long>_>::clear(&this->m_Maxima);
  for (pTStack_20 = *(TEdge **)
                     (this->_vptr_Clipper[-3] + 0x10 +
                     (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>
                     ); pTStack_20 != (TEdge *)0x0; pTStack_20 = pTStack_20->NextInAEL) {
    bVar1 = IsIntermediate(pTStack_20,(cInt)e);
    if (bVar1) {
      ePrev_2 = (TEdge *)0x0;
      if (-1 < pTStack_20->OutIdx) {
        ePrev_2 = (TEdge *)AddOutPt(this,pTStack_20,&pTStack_20->Top);
      }
      ClipperBase::UpdateEdgeIntoAEL
                ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),
                 &stack0xffffffffffffffe0);
      pTVar2 = pTStack_20->PrevInAEL;
      e_00 = pTStack_20->NextInAEL;
      if ((((pTVar2 == (TEdge *)0x0) || ((pTVar2->Curr).X != (pTStack_20->Bot).X)) ||
          (((pTVar2->Curr).Y != (pTStack_20->Bot).Y ||
           ((((ePrev_2 == (TEdge *)0x0 || (pTVar2->OutIdx < 0)) ||
             ((pTVar2->Curr).Y <= (pTVar2->Top).Y)) ||
            ((bVar1 = SlopesEqual(pTStack_20->Curr,pTStack_20->Top,pTVar2->Curr,pTVar2->Top,
                                  (bool)((byte)(this->_vptr_Clipper[-3] + 8)
                                               [(long)&(this->m_GhostJoins).
                                                                                                              
                                                  super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                               ] & 1)), !bVar1 || (pTStack_20->WindDelta == 0)))))))
          ) || (pTVar2->WindDelta == 0)) {
        if (((((e_00 != (TEdge *)0x0) && ((e_00->Curr).X == (pTStack_20->Bot).X)) &&
             (((e_00->Curr).Y == (pTStack_20->Bot).Y &&
              (((ePrev_2 != (TEdge *)0x0 && (-1 < e_00->OutIdx)) && ((e_00->Top).Y < (e_00->Curr).Y)
               ))))) &&
            ((bVar1 = SlopesEqual(pTStack_20->Curr,pTStack_20->Top,e_00->Curr,e_00->Top,
                                  (bool)((byte)(this->_vptr_Clipper[-3] + 8)
                                               [(long)&(this->m_GhostJoins).
                                                                                                              
                                                  super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                               ] & 1)), bVar1 && (pTStack_20->WindDelta != 0)))) &&
           (e_00->WindDelta != 0)) {
          pOVar4 = AddOutPt(this,e_00,&pTStack_20->Bot);
          AddJoin(this,(OutPt *)ePrev_2,pOVar4,pTStack_20->Top);
        }
      }
      else {
        pOVar4 = AddOutPt(this,pTVar2,&pTStack_20->Bot);
        AddJoin(this,(OutPt *)ePrev_2,pOVar4,pTStack_20->Top);
      }
    }
  }
  return;
}

Assistant:

void Clipper::ProcessEdgesAtTopOfScanbeam(const cInt topY)
{
  TEdge* e = m_ActiveEdges;
  while( e )
  {
    //1. process maxima, treating them as if they're 'bent' horizontal edges,
    //   but exclude maxima with horizontal edges. nb: e can't be a horizontal.
    bool IsMaximaEdge = IsMaxima(e, topY);

    if(IsMaximaEdge)
    {
      TEdge* eMaxPair = GetMaximaPairEx(e);
      IsMaximaEdge = (!eMaxPair || !IsHorizontal(*eMaxPair));
    }

    if(IsMaximaEdge)
    {
      if (m_StrictSimple) m_Maxima.push_back(e->Top.X);
      TEdge* ePrev = e->PrevInAEL;
      DoMaxima(e);
      if( !ePrev ) e = m_ActiveEdges;
      else e = ePrev->NextInAEL;
    }
    else
    {
      //2. promote horizontal edges, otherwise update Curr.X and Curr.Y ...
      if (IsIntermediate(e, topY) && IsHorizontal(*e->NextInLML))
      {
        UpdateEdgeIntoAEL(e);
        if (e->OutIdx >= 0)
          AddOutPt(e, e->Bot);
        AddEdgeToSEL(e);
      } 
      else
      {
        e->Curr.X = TopX( *e, topY );
        e->Curr.Y = topY;
#ifdef use_xyz
		e->Curr.Z = topY == e->Top.Y ? e->Top.Z : (topY == e->Bot.Y ? e->Bot.Z : 0);
#endif
	  }

      //When StrictlySimple and 'e' is being touched by another edge, then
      //make sure both edges have a vertex here ...
      if (m_StrictSimple)
      {  
        TEdge* ePrev = e->PrevInAEL;
        if ((e->OutIdx >= 0) && (e->WindDelta != 0) && ePrev && (ePrev->OutIdx >= 0) &&
          (ePrev->Curr.X == e->Curr.X) && (ePrev->WindDelta != 0))
        {
          IntPoint pt = e->Curr;
#ifdef use_xyz
          SetZ(pt, *ePrev, *e);
#endif
          OutPt* op = AddOutPt(ePrev, pt);
          OutPt* op2 = AddOutPt(e, pt);
          AddJoin(op, op2, pt); //StrictlySimple (type-3) join
        }
      }

      e = e->NextInAEL;
    }
  }

  //3. Process horizontals at the Top of the scanbeam ...
  m_Maxima.sort();
  ProcessHorizontals();
  m_Maxima.clear();

  //4. Promote intermediate vertices ...
  e = m_ActiveEdges;
  while(e)
  {
    if(IsIntermediate(e, topY))
    {
      OutPt* op = 0;
      if( e->OutIdx >= 0 ) 
        op = AddOutPt(e, e->Top);
      UpdateEdgeIntoAEL(e);

      //if output polygons share an edge, they'll need joining later ...
      TEdge* ePrev = e->PrevInAEL;
      TEdge* eNext = e->NextInAEL;
      if (ePrev && ePrev->Curr.X == e->Bot.X &&
        ePrev->Curr.Y == e->Bot.Y && op &&
        ePrev->OutIdx >= 0 && ePrev->Curr.Y > ePrev->Top.Y &&
        SlopesEqual(e->Curr, e->Top, ePrev->Curr, ePrev->Top, m_UseFullRange) &&
        (e->WindDelta != 0) && (ePrev->WindDelta != 0))
      {
        OutPt* op2 = AddOutPt(ePrev, e->Bot);
        AddJoin(op, op2, e->Top);
      }
      else if (eNext && eNext->Curr.X == e->Bot.X &&
        eNext->Curr.Y == e->Bot.Y && op &&
        eNext->OutIdx >= 0 && eNext->Curr.Y > eNext->Top.Y &&
        SlopesEqual(e->Curr, e->Top, eNext->Curr, eNext->Top, m_UseFullRange) &&
        (e->WindDelta != 0) && (eNext->WindDelta != 0))
      {
        OutPt* op2 = AddOutPt(eNext, e->Bot);
        AddJoin(op, op2, e->Top);
      }
    }
    e = e->NextInAEL;
  }
}